

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O3

void anon_unknown.dwarf_1913a4::StdReverb_getParami(EffectProps *props,ALenum param,int *val)

{
  effect_exception *this;
  
  if (param == 0xd) {
    *val = (uint)(props->Reverb).DecayHFLimit;
    return;
  }
  this = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception
            (this,0xa002,"Invalid reverb integer property 0x%04x",(ulong)(uint)param);
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void StdReverb_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_REVERB_DECAY_HFLIMIT:
        *val = props->Reverb.DecayHFLimit;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb integer property 0x%04x", param};
    }
}